

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# double-conversion-cached-powers.cpp
# Opt level: O0

void icu_63::double_conversion::PowersOfTenCache::GetCachedPowerForBinaryExponentRange
               (int min_exponent,int max_exponent,DiyFp *power,int *decimal_exponent)

{
  uint64_t uVar1;
  int exponent;
  double dVar2;
  DiyFp local_58;
  uint64_t local_48;
  CachedPower cached_power;
  int index;
  int foo;
  double k;
  int kQ;
  int *decimal_exponent_local;
  DiyFp *power_local;
  int max_exponent_local;
  int min_exponent_local;
  
  dVar2 = ceil((double)(min_exponent + 0x3f) * 0.30102999566398114);
  cached_power._12_4_ = 0x15c;
  cached_power._8_4_ = ((int)dVar2 + 0x15b) / 8 + 1;
  local_48 = *(uint64_t *)(kCachedPowers + (long)(int)cached_power._8_4_ * 0x10);
  uVar1 = *(uint64_t *)(kCachedPowers + (long)(int)cached_power._8_4_ * 0x10 + 8);
  cached_power.significand._2_2_ = (short)(uVar1 >> 0x10);
  *decimal_exponent = (int)cached_power.significand._2_2_;
  cached_power.significand._0_2_ = (short)uVar1;
  exponent = (int)(short)cached_power.significand;
  cached_power.significand = uVar1;
  DiyFp::DiyFp(&local_58,local_48,exponent);
  power->f_ = local_58.f_;
  power->e_ = local_58.e_;
  return;
}

Assistant:

void PowersOfTenCache::GetCachedPowerForBinaryExponentRange(
    int min_exponent,
    int max_exponent,
    DiyFp* power,
    int* decimal_exponent) {
  int kQ = DiyFp::kSignificandSize;
  double k = ceil((min_exponent + kQ - 1) * kD_1_LOG2_10);
  int foo = kCachedPowersOffset;
  int index =
      (foo + static_cast<int>(k) - 1) / kDecimalExponentDistance + 1;
  ASSERT(0 <= index && index < static_cast<int>(ARRAY_SIZE(kCachedPowers)));
  CachedPower cached_power = kCachedPowers[index];
  ASSERT(min_exponent <= cached_power.binary_exponent);
  (void) max_exponent;  // Mark variable as used.
  ASSERT(cached_power.binary_exponent <= max_exponent);
  *decimal_exponent = cached_power.decimal_exponent;
  *power = DiyFp(cached_power.significand, cached_power.binary_exponent);
}